

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O0

void sylvan_quit(void)

{
  quit_cb *pp_Var1;
  gc_hook_entry_t pgVar2;
  reg_quit_entry *__ptr;
  gc_hook_entry_t e_3;
  gc_hook_entry_t e_2;
  gc_hook_entry_t e_1;
  reg_quit_entry *e;
  
  while (__ptr = quit_register, quit_register != (reg_quit_entry *)0x0) {
    pp_Var1 = &quit_register->cb;
    quit_register = quit_register->next;
    (**pp_Var1)();
    free(__ptr);
  }
  while (pgVar2 = pregc_list, pregc_list != (gc_hook_entry_t)0x0) {
    pregc_list = pregc_list->next;
    free(pgVar2);
  }
  while (pgVar2 = postgc_list, postgc_list != (gc_hook_entry_t)0x0) {
    postgc_list = postgc_list->next;
    free(pgVar2);
  }
  while (pgVar2 = mark_list, mark_list != (gc_hook_entry_t)0x0) {
    mark_list = mark_list->next;
    free(pgVar2);
  }
  cache_free();
  llmsset_free((llmsset_t_conflict)nodes);
  return;
}

Assistant:

void
sylvan_quit()
{
    while (quit_register != NULL) {
        struct reg_quit_entry *e = quit_register;
        quit_register = e->next;
        e->cb();
        free(e);
    }

    while (pregc_list != NULL) {
        gc_hook_entry_t e = pregc_list;
        pregc_list = e->next;
        free(e);
    }

    while (postgc_list != NULL) {
        gc_hook_entry_t e = postgc_list;
        postgc_list = e->next;
        free(e);
    }

    while (mark_list != NULL) {
        gc_hook_entry_t e = mark_list;
        mark_list = e->next;
        free(e);
    }

    cache_free();
    llmsset_free(nodes);
}